

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::PrimaryChromaticity::Parse
               (IMkvReader *reader,longlong read_pos,longlong value_size,bool is_x,
               PrimaryChromaticity **chromaticity)

{
  PrimaryChromaticity *this;
  long lVar1;
  PrimaryChromaticity *local_90;
  PrimaryChromaticity *local_80;
  longlong parse_status;
  double parser_value;
  float *value;
  PrimaryChromaticity *pc;
  undefined1 local_41;
  PrimaryChromaticity *local_40;
  PrimaryChromaticity **local_38;
  PrimaryChromaticity **chromaticity_local;
  longlong lStack_28;
  bool is_x_local;
  longlong value_size_local;
  longlong read_pos_local;
  IMkvReader *reader_local;
  
  if (reader == (IMkvReader *)0x0) {
    reader_local._7_1_ = false;
  }
  else {
    local_38 = chromaticity;
    chromaticity_local._7_1_ = is_x;
    lStack_28 = value_size;
    value_size_local = read_pos;
    read_pos_local = (longlong)reader;
    if (*chromaticity == (PrimaryChromaticity *)0x0) {
      this = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
      local_41 = 0;
      local_80 = (PrimaryChromaticity *)0x0;
      if (this != (PrimaryChromaticity *)0x0) {
        local_41 = 1;
        local_40 = this;
        PrimaryChromaticity(this);
        local_80 = this;
      }
      *local_38 = local_80;
    }
    if (*local_38 == (PrimaryChromaticity *)0x0) {
      reader_local._7_1_ = false;
    }
    else {
      value = &(*local_38)->x;
      local_90 = (PrimaryChromaticity *)value;
      if ((chromaticity_local._7_1_ & 1) == 0) {
        local_90 = (PrimaryChromaticity *)&((PrimaryChromaticity *)value)->y;
      }
      parser_value = (double)local_90;
      parse_status = 0;
      lVar1 = UnserializeFloat((IMkvReader *)read_pos_local,value_size_local,lStack_28,
                               (double *)&parse_status);
      if ((((lVar1 < 0) || ((double)parse_status < 0.0)) || (1.0 < (double)parse_status)) ||
         ((0.0 < (double)parse_status && ((double)parse_status < 1.1754943508222875e-38)))) {
        reader_local._7_1_ = false;
      }
      else {
        *(float *)parser_value = (float)(double)parse_status;
        reader_local._7_1_ = true;
      }
    }
  }
  return reader_local._7_1_;
}

Assistant:

bool PrimaryChromaticity::Parse(IMkvReader* reader, long long read_pos,
                                long long value_size, bool is_x,
                                PrimaryChromaticity** chromaticity) {
  if (!reader)
    return false;

  if (!*chromaticity)
    *chromaticity = new (std::nothrow) PrimaryChromaticity();

  if (!*chromaticity)
    return false;

  PrimaryChromaticity* pc = *chromaticity;
  float* value = is_x ? &pc->x : &pc->y;

  double parser_value = 0;
  const long long parse_status =
      UnserializeFloat(reader, read_pos, value_size, parser_value);

  // Valid range is [0, 1]. Make sure the double is representable as a float
  // before casting.
  if (parse_status < 0 || parser_value < 0.0 || parser_value > 1.0 ||
      (parser_value > 0.0 && parser_value < FLT_MIN))
    return false;

  *value = static_cast<float>(parser_value);

  return true;
}